

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O2

bool __thiscall
irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::equalsn
          (CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this,unsigned_short *str1,
          unsigned_short *str2,int len)

{
  long lVar1;
  bool bVar2;
  
  lVar1 = 0;
  while( true ) {
    if (str1[lVar1] == 0) {
      bVar2 = true;
      if (len != (int)lVar1) {
        bVar2 = str2[lVar1] == 0;
      }
      return bVar2;
    }
    if ((len <= lVar1) || (str2[lVar1] == 0)) break;
    if (str1[lVar1] != str2[lVar1]) {
      return false;
    }
    lVar1 = lVar1 + 1;
  }
  return len == (int)lVar1;
}

Assistant:

bool equalsn(const char_type* str1, const char_type* str2, int len)
	{
		int i;
		for(i=0; str1[i] && str2[i] && i < len; ++i)
			if (str1[i] != str2[i])
				return false;

		// if one (or both) of the strings was smaller then they
		// are only equal if they have the same lenght
		return (i == len) || (str1[i] == 0 && str2[i] == 0);
	}